

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceUtils.cpp
# Opt level: O0

BlendEquationAdvanced sglr::rr_util::mapGLBlendEquationAdvanced(deUint32 equation)

{
  BlendEquationAdvanced local_c;
  deUint32 equation_local;
  
  switch(equation) {
  case 0x9294:
    local_c = BLENDEQUATION_ADVANCED_MULTIPLY;
    break;
  case 0x9295:
    local_c = BLENDEQUATION_ADVANCED_SCREEN;
    break;
  case 0x9296:
    local_c = BLENDEQUATION_ADVANCED_OVERLAY;
    break;
  case 0x9297:
    local_c = BLENDEQUATION_ADVANCED_DARKEN;
    break;
  case 0x9298:
    local_c = BLENDEQUATION_ADVANCED_LIGHTEN;
    break;
  case 0x9299:
    local_c = BLENDEQUATION_ADVANCED_COLORDODGE;
    break;
  case 0x929a:
    local_c = BLENDEQUATION_ADVANCED_COLORBURN;
    break;
  case 0x929b:
    local_c = BLENDEQUATION_ADVANCED_HARDLIGHT;
    break;
  case 0x929c:
    local_c = BLENDEQUATION_ADVANCED_SOFTLIGHT;
    break;
  default:
    local_c = BLENDEQUATION_ADVANCED_LAST;
    break;
  case 0x929e:
    local_c = BLENDEQUATION_ADVANCED_DIFFERENCE;
    break;
  case 0x92a0:
    local_c = BLENDEQUATION_ADVANCED_EXCLUSION;
    break;
  case 0x92ad:
    local_c = BLENDEQUATION_ADVANCED_HSL_HUE;
    break;
  case 0x92ae:
    local_c = BLENDEQUATION_ADVANCED_HSL_SATURATION;
    break;
  case 0x92af:
    local_c = BLENDEQUATION_ADVANCED_HSL_COLOR;
    break;
  case 0x92b0:
    local_c = BLENDEQUATION_ADVANCED_HSL_LUMINOSITY;
  }
  return local_c;
}

Assistant:

rr::BlendEquationAdvanced mapGLBlendEquationAdvanced (deUint32 equation)
{
	switch (equation)
	{
		case GL_MULTIPLY_KHR:		return rr::BLENDEQUATION_ADVANCED_MULTIPLY;
		case GL_SCREEN_KHR:			return rr::BLENDEQUATION_ADVANCED_SCREEN;
		case GL_OVERLAY_KHR:		return rr::BLENDEQUATION_ADVANCED_OVERLAY;
		case GL_DARKEN_KHR:			return rr::BLENDEQUATION_ADVANCED_DARKEN;
		case GL_LIGHTEN_KHR:		return rr::BLENDEQUATION_ADVANCED_LIGHTEN;
		case GL_COLORDODGE_KHR:		return rr::BLENDEQUATION_ADVANCED_COLORDODGE;
		case GL_COLORBURN_KHR:		return rr::BLENDEQUATION_ADVANCED_COLORBURN;
		case GL_HARDLIGHT_KHR:		return rr::BLENDEQUATION_ADVANCED_HARDLIGHT;
		case GL_SOFTLIGHT_KHR:		return rr::BLENDEQUATION_ADVANCED_SOFTLIGHT;
		case GL_DIFFERENCE_KHR:		return rr::BLENDEQUATION_ADVANCED_DIFFERENCE;
		case GL_EXCLUSION_KHR:		return rr::BLENDEQUATION_ADVANCED_EXCLUSION;
		case GL_HSL_HUE_KHR:		return rr::BLENDEQUATION_ADVANCED_HSL_HUE;
		case GL_HSL_SATURATION_KHR:	return rr::BLENDEQUATION_ADVANCED_HSL_SATURATION;
		case GL_HSL_COLOR_KHR:		return rr::BLENDEQUATION_ADVANCED_HSL_COLOR;
		case GL_HSL_LUMINOSITY_KHR:	return rr::BLENDEQUATION_ADVANCED_HSL_LUMINOSITY;
		default:
			DE_ASSERT(false);
			return rr::BLENDEQUATION_ADVANCED_LAST;
	}
}